

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kf_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_46c44b::ForcedKeyTestLarge::PreEncodeFrameHook
          (ForcedKeyTestLarge *this,VideoSource *video,Encoder *encoder)

{
  int iVar1;
  __tuple_element_t<0UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int,_aom_rc_mode>_>
  *ppCVar2;
  long *in_RSI;
  long in_RDI;
  int in_stack_00000048;
  int in_stack_0000004c;
  Encoder *in_stack_00000050;
  
  iVar1 = (**(code **)(*in_RSI + 0x40))();
  if (iVar1 == 0) {
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    testing::
    WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>_>
    ::GetParam();
    ppCVar2 = std::
              get<0ul,libaom_test::CodecFactory_const*,libaom_test::TestMode,int,int,int,aom_rc_mode>
                        ((tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode,_int,_int,_int,_aom_rc_mode>
                          *)0x57a08e);
    if (*ppCVar2 ==
        (__tuple_element_t<0UL,_tuple<const_CodecFactory_*,_TestMode,_int,_int,_int,_aom_rc_mode>_>)
        &libaom_test::kAV1) {
      libaom_test::Encoder::Control(in_stack_00000050,in_stack_0000004c,in_stack_00000048);
    }
  }
  iVar1 = (**(code **)(*in_RSI + 0x40))();
  *(long *)(in_RDI + 1000) = (long)(int)(uint)(iVar1 == *(int *)(in_RDI + 0x408));
  return;
}

Assistant:

void PreEncodeFrameHook(::libaom_test::VideoSource *video,
                          ::libaom_test::Encoder *encoder) override {
    if (video->frame() == 0) {
      encoder->Control(AOME_SET_CPUUSED, cpu_used_);
      encoder->Control(AOME_SET_ENABLEAUTOALTREF, auto_alt_ref_);
#if CONFIG_AV1_ENCODER
      // override test default for tile columns if necessary.
      if (GET_PARAM(0) == &libaom_test::kAV1) {
        encoder->Control(AV1E_SET_TILE_COLUMNS, 6);
      }
#endif
    }
    frame_flags_ =
        ((int)video->frame() == forced_kf_frame_num_) ? AOM_EFLAG_FORCE_KF : 0;
  }